

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O1

void __thiscall
jsonnet::internal::anon_unknown_0::Heap::addIfHeapEntity
          (Heap *this,HeapEntity *v,
          vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
          *vec)

{
  _func_int **__src;
  _func_int **__src_00;
  long lVar1;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *this_00;
  pointer __dest;
  size_t sVar2;
  HeapEntity *__n;
  void *__dest_00;
  
  __src = *(_func_int ***)&v->mark;
  if (__src == v[1]._vptr_HeapEntity) {
    __n = v;
    this_00 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               *)std::
                 vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                 ::_M_check_len((vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                                 *)v,(size_type)v,(char *)vec);
    __src_00 = v->_vptr_HeapEntity;
    lVar1 = *(long *)&v->mark;
    sVar2 = (long)__src - (long)__src_00;
    __dest = std::
             _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
             ::_M_allocate(this_00,(size_t)__n);
    *(Heap **)((long)__dest + sVar2) = this;
    if (0 < (long)sVar2) {
      memmove(__dest,__src_00,sVar2);
    }
    __dest_00 = (void *)((long)__dest + sVar2 + 8);
    sVar2 = lVar1 - (long)__src;
    if (0 < (long)sVar2) {
      memcpy(__dest_00,__src,sVar2);
    }
    if (__src_00 != (_func_int **)0x0) {
      operator_delete(__src_00,(long)v[1]._vptr_HeapEntity - (long)__src_00);
    }
    v->_vptr_HeapEntity = (_func_int **)__dest;
    *(size_t *)&v->mark = (long)__dest_00 + sVar2;
    v[1]._vptr_HeapEntity = (_func_int **)(__dest + (long)this_00);
  }
  else {
    *__src = (_func_int *)this;
    *(long *)&v->mark = *(long *)&v->mark + 8;
  }
  return;
}

Assistant:

void addIfHeapEntity(HeapEntity *v, std::vector<HeapEntity *> &vec)
    {
        vec.push_back(v);
    }